

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

member_t *
kiste::parse_class_member(member_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  parse_error *ppVar1;
  long lVar2;
  string local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> member_name;
  size_type nameEnd;
  size_type nameBegin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> member_class_name;
  size_type classEnd;
  size_type classBegin;
  string *line_local;
  parse_context *ctx_local;
  
  if (ctx->_class_curly_level == 0) {
    ppVar1 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar1,"Cannot add a member here, did you forget to call $class?");
    __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
  }
  lVar2 = std::__cxx11::string::find_first_not_of((char *)line,0x1120da);
  if (lVar2 == -1) {
    ppVar1 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar1,"Could not find member class name");
    __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
  }
  member_class_name.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)line,0x1120da);
  if (member_class_name.field_2._8_8_ == -1) {
    ppVar1 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar1,"Could not find member name");
    __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
  }
  std::__cxx11::string::substr((ulong)&nameBegin,(ulong)line);
  lVar2 = std::__cxx11::string::find_first_not_of((char *)line,0x1120da);
  if (lVar2 == -1) {
    ppVar1 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar1,"Could not find member name");
    __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
  }
  member_name.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)line,0x1120da);
  if (member_name.field_2._8_8_ == -1) {
    std::__cxx11::string::substr((ulong)local_90,(ulong)line);
  }
  else {
    std::__cxx11::string::substr((ulong)local_90,(ulong)line);
  }
  lVar2 = std::__cxx11::string::find_first_not_of((char *)line,0x1120da);
  if (lVar2 != -1) {
    ppVar1 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar1,"unexpected characters after member declaration");
    __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&nameBegin);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->name,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&nameBegin);
  return __return_storage_ptr__;
}

Assistant:

auto parse_class_member(const parse_context& ctx, const std::string& line) -> member_t
  {
    if (not ctx._class_curly_level)
    {
      throw parse_error("Cannot add a member here, did you forget to call $class?");
    }
    const auto classBegin = line.find_first_not_of(" \t", std::strlen("member"));
    if (classBegin == line.npos)
      throw parse_error("Could not find member class name");
    const auto classEnd = line.find_first_of(" \t", classBegin);
    if (classEnd == line.npos)
      throw parse_error("Could not find member name");

    const auto member_class_name = line.substr(classBegin, classEnd - classBegin);

    const auto nameBegin = line.find_first_not_of(" \t", classEnd);
    if (nameBegin == line.npos)
      throw parse_error("Could not find member name");
    const auto nameEnd = line.find_first_of(" \t", nameBegin);

    const auto member_name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                                    : line.substr(nameBegin, nameEnd - nameBegin);

    if (line.find_first_not_of(" \t", nameEnd) != line.npos)
    {
      throw parse_error("unexpected characters after member declaration");
    }

    return {member_class_name, member_name};
  }